

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

void __thiscall google::protobuf::io::Printer::Outdent(Printer *this)

{
  ulong uVar1;
  LogMessage *other;
  LogFinisher local_55 [13];
  LogMessage local_48;
  Printer *local_10;
  Printer *this_local;
  
  local_10 = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)&this->indent_);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/io/printer.cc"
               ,0x97);
    other = internal::LogMessage::operator<<(&local_48," Outdent() without matching Indent().");
    internal::LogFinisher::operator=(local_55,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return;
}

Assistant:

void Printer::Outdent() {
  if (indent_.empty()) {
    GOOGLE_LOG(DFATAL) << " Outdent() without matching Indent().";
    return;
  }

  indent_.resize(indent_.size() - 2);
}